

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * __thiscall
pybind11::cpp_function::dispatcher
          (cpp_function *this,PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  ushort uVar1;
  PyTypeObject *pPVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer phVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  type_info *find_type;
  undefined8 extraout_RAX;
  internals *piVar11;
  undefined8 *puVar12;
  long *plVar13;
  long lVar14;
  function_call *pfVar15;
  function_call *pfVar16;
  function_record *pfVar17;
  object *poVar18;
  _Bit_type *p_Var19;
  instance *piVar20;
  ulong uVar21;
  uint uVar22;
  PyObject *tmp;
  value_and_holder *__return_storage_ptr__;
  _Bit_type *p_Var23;
  uint __len;
  function_call *pfVar24;
  uint __uval;
  handle hVar25;
  instance *piVar26;
  function_record *pfVar27;
  handle hVar28;
  _Bit_type *p_Var29;
  bool bVar30;
  handle arg;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  function_call call;
  dict kwargs_1;
  dict kwargs;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  instance *pi;
  undefined1 local_1e8 [24];
  object oStack_1d0;
  pointer local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  pointer local_198;
  function_call *local_190;
  function_call *local_188;
  undefined4 local_17c;
  undefined1 local_178 [8];
  undefined1 auStack_170 [16];
  handle hStack_160;
  anon_union_24_2_63b86169_for_instance_1 local_158;
  handle hStack_140;
  pointer local_138;
  object oStack_130;
  object local_128;
  handle local_120;
  handle local_118;
  handle local_110;
  handle local_108;
  long local_100;
  PyObject local_f8;
  undefined1 local_e8 [32];
  instance *local_c8;
  uint local_bc;
  _Bit_type *local_b8;
  PyTypeObject *local_b0;
  value_and_holder *local_a8;
  _Bit_type *local_a0;
  undefined1 local_98 [56];
  object local_60;
  value_and_holder *local_58;
  handle local_50;
  handle local_48;
  handle local_40;
  handle local_38;
  
  local_c8 = (instance *)PyCapsule_GetPointer(this,0);
  if ((self->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                  ,0x1e5,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  p_Var23 = (_Bit_type *)self[1].ob_refcnt;
  if (p_Var23 == (_Bit_type *)0x0) {
    local_b0 = (PyTypeObject *)0x0;
  }
  else {
    local_b0 = self[1].ob_type;
  }
  local_98._16_8_ = (type_info *)0x0;
  local_98._24_8_ = (PyObject *)0x0;
  local_98._0_8_ = (function_record *)0x0;
  local_98._8_8_ = (instance *)0x0;
  local_190 = (function_call *)self;
  if ((*(byte *)((long)&local_c8[1].field_1 + 0x11) & 1) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)local_c8[2].ob_base.ob_refcnt);
    __return_storage_ptr__ = (value_and_holder *)local_178;
    detail::instance::get_value_and_holder
              (__return_storage_ptr__,(instance *)local_b0,find_type,false);
    local_98._16_8_ = auStack_170._8_8_;
    local_98._24_8_ = hStack_160.m_ptr;
    local_98._0_8_ = local_178;
    local_98._8_8_ = auStack_170._0_8_;
    kwargs_in = (PyObject *)local_178;
    if ((type_info *)auStack_170._8_8_ == (type_info *)0x0 || local_178 == (undefined1  [8])0x0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      bVar30 = false;
      __return_storage_ptr__ = (value_and_holder *)0x0;
    }
    else {
      bVar8 = (byte)((PyObject *)((long)local_178 + 0x30))->ob_refcnt;
      if ((bVar8 & 2) == 0) {
        bVar8 = *(byte *)((long)&(((PyObject *)((long)local_178 + 0x10))->ob_type->ob_base).ob_base.
                                 ob_refcnt + (long)&((PyObject *)auStack_170._0_8_)->ob_refcnt) & 2;
        kwargs_in = (PyObject *)auStack_170._0_8_;
      }
      else {
        bVar8 = bVar8 >> 3 & 1;
      }
      if (bVar8 == 0) {
        bVar30 = true;
      }
      else {
        __return_storage_ptr__ = (value_and_holder *)&_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
        local_178 = (undefined1  [8])0x0;
        object::~object((object *)local_178);
        bVar30 = false;
      }
    }
    local_58 = __return_storage_ptr__;
    if (!bVar30) {
      return (PyObject *)__return_storage_ptr__;
    }
  }
  local_e8._0_8_ = (PyObject *)0x0;
  local_e8._8_8_ = (function_call *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_188 = (function_call *)args_in;
  if (local_c8 == (instance *)0x0) {
    local_17c = 0;
    hVar28.m_ptr = (PyObject *)0x1;
  }
  else {
    local_17c = (undefined4)
                CONCAT71((int7)((ulong)kwargs_in >> 8),
                         local_c8[2].field_1.nonsimple.values_and_holders != (void **)0x0);
    local_50.m_ptr =
         (PyObject *)
         &(local_190->args).super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    hVar28.m_ptr = (PyObject *)0x1;
    hVar25.m_ptr = &local_c8->ob_base;
    local_b8 = p_Var23;
    do {
      uVar1 = *(ushort *)((long)&hVar25.m_ptr[5].ob_type + 1);
      uVar22 = (uVar1 & 0x20) >> 5;
      local_98._48_8_ =
           (long)(short)((uint)(int)(short)(uVar1 << 9) >> 0xf) +
           ((ulong)*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 4) - (ulong)uVar22);
      p_Var19 = (_Bit_type *)
                (local_98._48_8_ - (ulong)*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 6));
      if (((uVar22 == 0) && (p_Var19 < p_Var23)) ||
         ((local_a0 = p_Var19, p_Var23 < p_Var19 &&
          ((_Bit_type *)(hVar25.m_ptr[2].ob_refcnt - (long)hVar25.m_ptr[1].ob_type >> 5) < p_Var19))
         )) {
        bVar30 = false;
      }
      else {
        local_158.simple_value_holder[2] = (function_call *)0x0;
        hStack_140.m_ptr = hStack_140.m_ptr & 0xffffffff00000000;
        local_158.simple_value_holder[1] =
             (void *)((ulong)local_158.simple_value_holder[1] & 0xffffffff00000000);
        hStack_160.m_ptr = (PyObject *)0x0;
        local_158.simple_value_holder[0] = (function_call *)0x0;
        auStack_170._0_8_ = (instance *)0x0;
        auStack_170._8_8_ = (type_info *)0x0;
        local_128.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_138 = (pointer)0x0;
        oStack_130.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_120.m_ptr = (PyObject *)local_b0;
        local_118.m_ptr = (PyObject *)0x0;
        local_178 = (undefined1  [8])hVar25.m_ptr;
        local_a8 = (value_and_holder *)hVar28.m_ptr;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_170,
                   (ulong)*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 4));
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,
                   (ulong)*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 4));
        p_Var19 = local_a0;
        if (p_Var23 < local_a0) {
          p_Var19 = p_Var23;
        }
        if (((ulong)hVar25.m_ptr[5].ob_type & 0x200) == 0) {
          p_Var29 = (_Bit_type *)0x0;
        }
        else {
          if (*(PyObject **)local_98._24_8_ != (PyObject *)0x0) {
            (**(type **)(local_98._16_8_ + 0x38))((value_and_holder *)local_98);
          }
          if ((((PyTypeObject *)
               (local_190->args).
               super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
               super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_in)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                          ,0x232,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          local_118.m_ptr =
               (PyObject *)
               (local_190->args).
               super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1e8._0_8_ = (function_call *)local_98;
          if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<_object*>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_170,
                       (iterator)auStack_170._8_8_,(_object **)local_1e8);
          }
          else {
            *(PyObject **)auStack_170._8_8_ = (PyObject *)local_98;
            auStack_170._8_8_ = auStack_170._8_8_ + 8;
          }
          p_Var29 = (_Bit_type *)0x1;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,false);
        }
        if (p_Var29 < p_Var19) {
          uVar21 = (ulong)(uint)((int)p_Var29 << 5);
          bVar30 = false;
          do {
            plVar13 = (long *)((long)&((hVar25.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt +
                              uVar21);
            if ((_Bit_type *)(hVar25.m_ptr[2].ob_refcnt - (long)hVar25.m_ptr[1].ob_type >> 5) <=
                p_Var29) {
              plVar13 = (long *)0x0;
            }
            if ((((local_188 == (function_call *)0x0) || (plVar13 == (long *)0x0)) ||
                (*plVar13 == 0)) || (lVar14 = PyDict_GetItemString(local_188), lVar14 == 0)) {
              if ((((PyTypeObject *)
                   (local_190->args).
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                              ,0x241,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1e8._0_8_ =
                   *(undefined8 *)
                    ((long)&(local_190->args).
                            super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + (long)p_Var29 * 8);
              if (((plVar13 == (long *)0x0) || ((*(byte *)(plVar13 + 3) & 2) != 0)) ||
                 ((function_call *)local_1e8._0_8_ != (function_call *)&_Py_NoneStruct)) {
                if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_170,(iterator)auStack_170._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_170._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_170._8_8_ = auStack_170._8_8_ + 8;
                }
                bVar3 = true;
                bVar8 = 1;
                if (plVar13 != (long *)0x0) {
                  bVar8 = *(byte *)(plVar13 + 3);
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,
                           (bool)(bVar8 & 1));
              }
              else {
                bVar3 = false;
                bVar30 = true;
              }
            }
            else {
              bVar30 = true;
              bVar3 = false;
            }
            p_Var23 = local_b8;
            if (!bVar3) break;
            p_Var29 = (_Bit_type *)((long)p_Var29 + 1);
            uVar21 = uVar21 + 0x20;
          } while (p_Var19 != p_Var29);
        }
        else {
          bVar30 = false;
        }
        if (bVar30) {
          bVar30 = false;
        }
        else {
          local_108.m_ptr = (PyObject *)local_188;
          if (local_188 != (function_call *)0x0) {
            ((PyObject *)&local_188->func)->ob_refcnt =
                 ((PyObject *)&local_188->func)->ob_refcnt + 1;
          }
          if (p_Var29 < (_Bit_type *)(ulong)(ushort)hVar25.m_ptr[6].ob_refcnt) {
            if (p_Var29 < (_Bit_type *)(ulong)(ushort)hVar25.m_ptr[6].ob_refcnt) {
              uVar21 = (long)p_Var29 << 5 | 0x10;
              do {
                pPVar2 = hVar25.m_ptr[1].ob_type;
                local_1e8._0_8_ = (function_call *)0x0;
                if (*(long *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21) != 0) {
                  local_1e8._0_8_ =
                       *(undefined8 *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21);
                }
                uVar4 = local_1e8._0_8_;
                if ((function_call *)local_1e8._0_8_ == (function_call *)0x0) break;
                if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_170,(iterator)auStack_170._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_170._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_170._8_8_ = auStack_170._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,
                           (bool)(*(byte *)((long)&(pPVar2->ob_base).ob_base.ob_type + uVar21) & 1))
                ;
                if ((function_call *)uVar4 == (function_call *)0x0) break;
                p_Var29 = (_Bit_type *)((long)p_Var29 + 1);
                uVar21 = uVar21 + 0x20;
              } while (p_Var29 < (ulong)(ushort)hVar25.m_ptr[6].ob_refcnt);
            }
            if ((_Bit_type *)(ulong)(ushort)hVar25.m_ptr[6].ob_refcnt <= p_Var29) goto LAB_0010cc61;
LAB_0010cdf1:
            bVar30 = false;
          }
          else {
LAB_0010cc61:
            if (p_Var29 < (ulong)local_98._48_8_) {
              lVar14 = (long)p_Var29 << 5;
              bVar30 = true;
              local_bc = 0;
              do {
                pPVar2 = hVar25.m_ptr[1].ob_type;
                local_1e8._0_8_ = (function_call *)0x0;
                if ((local_188 != (function_call *)0x0) &&
                   (*(long *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + lVar14) != 0)) {
                  local_1e8._0_8_ = PyDict_GetItemString(local_108.m_ptr);
                }
                if ((function_call *)local_1e8._0_8_ == (function_call *)0x0) {
                  if (*(long *)((long)&(pPVar2->ob_base).ob_size + lVar14) != 0) {
                    local_1e8._0_8_ = *(undefined8 *)((long)&(pPVar2->ob_base).ob_size + lVar14);
                  }
                }
                else {
                  if ((local_bc & 1) == 0) {
                    local_1b8._0_8_ = PyDict_Copy(local_108.m_ptr);
                    object::operator=((object *)&local_108,(object *)local_1b8);
                    object::~object((object *)local_1b8);
                    local_bc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  PyDict_DelItemString(local_108.m_ptr);
                }
                uVar4 = local_1e8._0_8_;
                if ((function_call *)local_1e8._0_8_ == (function_call *)0x0) {
LAB_0010cd9c:
                  if (bVar30) {
                    bVar30 = false;
                    p_Var23 = local_b8;
                    goto LAB_0010d288;
                  }
                  break;
                }
                if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_170,(iterator)auStack_170._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_170._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_170._8_8_ = auStack_170._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,
                           (bool)(*(byte *)((long)&pPVar2->tp_name + lVar14) & 1));
                if ((function_call *)uVar4 == (function_call *)0x0) goto LAB_0010cd9c;
                p_Var29 = (_Bit_type *)((long)p_Var29 + 1);
                lVar14 = lVar14 + 0x20;
                bVar30 = p_Var29 < (ulong)local_98._48_8_;
              } while (bVar30);
            }
            p_Var23 = local_b8;
            if ((((function_call *)local_108.m_ptr != (function_call *)0x0) &&
                (lVar14 = PyDict_Size(), lVar14 != 0)) &&
               (((ulong)hVar25.m_ptr[5].ob_type & 0x4000) == 0)) goto LAB_0010cdf1;
            if (((ulong)hVar25.m_ptr[5].ob_type & 0x2000) != 0) {
              tuple::tuple((tuple *)local_1b8,0);
              if (p_Var19 == (_Bit_type *)0x0) {
                local_1e8._0_8_ = local_190;
                if (local_190 != (function_call *)0x0) {
                  ((PyObject *)&local_190->func)->ob_refcnt =
                       ((PyObject *)&local_190->func)->ob_refcnt + 1;
                }
LAB_0010cee3:
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              else {
                pfVar24 = (function_call *)((long)p_Var23 - (long)p_Var29);
                if (p_Var23 < p_Var29 || pfVar24 == (function_call *)0x0) {
                  tuple::tuple((tuple *)local_1e8,0);
                  goto LAB_0010cee3;
                }
                tuple::tuple((tuple *)local_1e8,(size_t)pfVar24);
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
                hVar28.m_ptr = local_50.m_ptr;
                if (p_Var23 != p_Var29) {
                  pfVar15 = (function_call *)0x0;
                  do {
                    if ((((PyTypeObject *)
                         (local_190->args).
                         super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                      __assert_fail("PyTuple_Check(args_in)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                                    ,0x296,
                                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                   );
                    }
                    local_1e8._8_8_ = local_1b8._0_8_;
                    oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
                    local_1e8._16_8_ = pfVar15;
                    detail::accessor_policies::tuple_item::set
                              ((handle)local_1b8._0_8_,(size_t)pfVar15,
                               (PyObject *)
                               (&(hVar28.m_ptr)->ob_refcnt)[(long)((long)p_Var29 + (long)pfVar15)]);
                    object::~object((object *)(local_1e8 + 0x18));
                    pfVar15 = (function_call *)((long)&((PyObject *)&pfVar15->func)->ob_refcnt + 1);
                  } while (pfVar24 != pfVar15);
                }
              }
              if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_170,
                           (iterator)auStack_170._8_8_,(handle *)local_1b8);
              }
              else {
                *(PyObject **)auStack_170._8_8_ = (PyObject *)local_1b8._0_8_;
                auStack_170._8_8_ = auStack_170._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,false);
              object::operator=(&oStack_130,(object *)local_1b8);
              object::~object((object *)local_1b8);
            }
            if (((ulong)hVar25.m_ptr[5].ob_type & 0x4000) != 0) {
              if ((function_call *)local_108.m_ptr == (function_call *)0x0) {
                dict::dict((dict *)local_1e8);
                object::operator=((object *)&local_108,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              if ((PyObject *)auStack_170._8_8_ == hStack_160.m_ptr) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_170,
                           (iterator)auStack_170._8_8_,&local_108);
              }
              else {
                *(PyObject **)auStack_170._8_8_ = local_108.m_ptr;
                auStack_170._8_8_ = auStack_170._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_158.nonsimple,false);
              object::operator=(&local_128,(object *)&local_108);
            }
            uVar21 = (ulong)*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 4);
            if (((long)(auStack_170._8_8_ - auStack_170._0_8_) >> 3 != uVar21) ||
               (((ulong)hStack_140.m_ptr & 0xffffffff) +
                ((long)local_158.simple_value_holder[2] - local_158._0_8_) * 8 != uVar21)) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            local_1b8._0_8_ = (PyObject *)0x0;
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
            local_1a8._0_8_ = (function_record *)0x0;
            local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
            local_198 = (pointer)0x0;
            if ((byte)local_17c != '\0') {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1b8,uVar21,false);
              phVar7 = local_138;
              hVar28.m_ptr = hStack_140.m_ptr;
              uVar6 = local_158.simple_value_holder[2];
              uVar5 = local_158.simple_value_holder[1];
              uVar4 = local_158.simple_value_holder[0];
              local_1c8 = local_138;
              local_1e8._16_8_ = local_158.simple_value_holder[2];
              oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_140.m_ptr;
              local_1e8._0_8_ = local_158.simple_value_holder[0];
              local_1e8._8_8_ = local_158.simple_value_holder[1];
              local_138 = local_198;
              local_158.simple_value_holder[2] = (void *)local_1a8._0_8_;
              hStack_140.m_ptr = (PyObject *)local_1a8._8_8_;
              local_158.simple_value_holder[0] = (void *)local_1b8._0_8_;
              local_158.simple_value_holder[1] = (void *)local_1b8._8_8_;
              local_1b8._0_8_ = uVar4;
              local_1b8._8_8_ = uVar5;
              local_1a8._0_8_ = uVar6;
              local_1a8._8_8_ = hVar28.m_ptr;
              local_198 = phVar7;
            }
            piVar11 = detail::get_internals();
            local_40.m_ptr = (PyObject *)0x0;
            std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                      ((vector<_object*,std::allocator<_object*>> *)&piVar11->loader_patient_stack,
                       &local_40.m_ptr);
            local_a8 = (value_and_holder *)(*(code *)hVar25.m_ptr[3].ob_refcnt)(local_178);
            detail::loader_life_support::~loader_life_support((loader_life_support *)local_1e8);
            phVar7 = local_138;
            hVar28.m_ptr = hStack_140.m_ptr;
            uVar6 = local_158.simple_value_holder[2];
            uVar5 = local_158.simple_value_holder[1];
            uVar4 = local_158.simple_value_holder[0];
            bVar30 = local_a8 != (value_and_holder *)0x1;
            if (((byte)local_17c & local_a8 == (value_and_holder *)0x1) != 0) {
              bVar30 = false;
              for (p_Var19 = (_Bit_type *)
                             (ulong)(*(ushort *)((long)&hVar25.m_ptr[5].ob_type + 1) >> 4 & 1);
                  p_Var19 < local_a0; p_Var19 = (_Bit_type *)((long)p_Var19 + 1)) {
                p_Var29 = (_Bit_type *)((long)p_Var19 + 0x3f);
                if (-1 < (long)p_Var19) {
                  p_Var29 = p_Var19;
                }
                if ((*(ulong *)(local_1b8._0_8_ +
                               (ulong)(((ulong)p_Var19 & 0x800000000000003f) < 0x8000000000000001) *
                               8 + ((long)p_Var29 >> 6) * 8 + -8) >> ((ulong)p_Var19 & 0x3f) & 1) !=
                    0) {
                  local_1c8 = local_138;
                  local_1e8._16_8_ = local_158.simple_value_holder[2];
                  oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_140.m_ptr;
                  local_1e8._0_8_ = local_158.simple_value_holder[0];
                  local_1e8._8_8_ = local_158.simple_value_holder[1];
                  bVar30 = false;
                  local_138 = local_198;
                  local_158.simple_value_holder[2] = (void *)local_1a8._0_8_;
                  hStack_140.m_ptr = (PyObject *)local_1a8._8_8_;
                  local_158.simple_value_holder[0] = (void *)local_1b8._0_8_;
                  local_158.simple_value_holder[1] = (void *)local_1b8._8_8_;
                  local_1b8._0_8_ = uVar4;
                  local_1b8._8_8_ = uVar5;
                  local_1a8._0_8_ = uVar6;
                  local_1a8._8_8_ = hVar28.m_ptr;
                  local_198 = phVar7;
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::emplace_back<pybind11::detail::function_call>
                            ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)local_e8,(function_call *)local_178);
                  break;
                }
              }
            }
            if ((PyObject *)local_1b8._0_8_ != (PyObject *)0x0) {
              operator_delete((void *)local_1b8._0_8_,(long)local_198 - local_1b8._0_8_);
              local_1b8._0_8_ = (PyObject *)0x0;
              local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
              local_1a8._0_8_ = (function_record *)0x0;
              local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
              local_198 = (pointer)0x0;
            }
          }
LAB_0010d288:
          object::~object((object *)&local_108);
        }
        object::~object(&local_128);
        object::~object(&oStack_130);
        if ((function_call *)local_158.simple_value_holder[0] != (function_call *)0x0) {
          operator_delete(local_158.simple_value_holder[0],(long)local_138 - local_158._0_8_);
          local_158.simple_value_holder[0] = (function_call *)0x0;
          local_158.simple_value_holder[1] =
               (void *)((ulong)local_158.simple_value_holder[1] & 0xffffffff00000000);
          local_158.simple_value_holder[2] = (function_call *)0x0;
          hStack_140.m_ptr = hStack_140.m_ptr & 0xffffffff00000000;
          local_138 = (pointer)0x0;
        }
        hVar28.m_ptr = (PyObject *)local_a8;
        if ((instance *)auStack_170._0_8_ != (instance *)0x0) {
          operator_delete((void *)auStack_170._0_8_,(long)hStack_160.m_ptr - auStack_170._0_8_);
          hVar28.m_ptr = (PyObject *)local_a8;
        }
      }
    } while ((!bVar30) &&
            (hVar25.m_ptr = (PyObject *)hVar25.m_ptr[8].ob_refcnt,
            (instance *)hVar25.m_ptr != (instance *)0x0));
  }
  uVar4 = local_e8._8_8_;
  if (((byte)local_17c != '\0') &&
     ((local_e8._0_8_ != local_e8._8_8_ &&
      ((value_and_holder *)hVar28.m_ptr == (value_and_holder *)0x1)))) {
    pfVar24 = (function_call *)local_e8._0_8_;
    do {
      piVar11 = detail::get_internals();
      local_38.m_ptr = (PyObject *)0x0;
      std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                ((vector<_object*,std::allocator<_object*>> *)&piVar11->loader_patient_stack,
                 &local_38.m_ptr);
      hVar28 = (*pfVar24->func->impl)(pfVar24);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_178);
      if (hVar28.m_ptr != (PyObject *)0x1) break;
      pfVar24 = pfVar24 + 1;
    } while (pfVar24 != (function_call *)uVar4);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_e8);
  piVar26 = local_c8;
  if ((value_and_holder *)hVar28.m_ptr == (value_and_holder *)0x0) {
    local_178 = (undefined1  [8])(auStack_170 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_178);
    lVar14 = std::__cxx11::string::find(local_178,0x117e7d,0);
    if (lVar14 != -1) {
      std::__cxx11::string::append(local_178);
    }
    PyErr_SetString(_PyExc_TypeError,local_178);
    if (local_178 == (undefined1  [8])(auStack_170 + 8)) {
      return (PyObject *)(value_and_holder *)0x0;
    }
    goto LAB_0010e00a;
  }
  if ((value_and_holder *)hVar28.m_ptr != (value_and_holder *)0x1) {
    if ((*(byte *)((long)&local_c8[1].field_1 + 0x11) & 1) == 0) {
      return hVar28.m_ptr;
    }
    if ((*(byte *)(local_98._0_8_ + 0x30) & 2) == 0) {
      bVar8 = *(byte *)((long)&((PyObject *)local_98._8_8_)->ob_refcnt +
                       (long)(((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                *)(local_98._0_8_ + 0x18))->
                             super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      bVar8 = *(byte *)(local_98._0_8_ + 0x30) >> 2;
    }
    if ((bVar8 & 1) == 0) {
      (**(_func_void_instance_ptr_void_ptr **)(local_98._16_8_ + 0x30))
                ((instance *)local_b0,(void *)0x0);
      return hVar28.m_ptr;
    }
    return hVar28.m_ptr;
  }
  if ((*(byte *)((long)&local_c8[1].field_1 + 0x11) & 8) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)(value_and_holder *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,(char *)(local_c8->ob_base).ob_refcnt,(allocator<char> *)&local_110)
  ;
  puVar12 = (undefined8 *)std::__cxx11::string::append(local_e8);
  pfVar24 = (function_call *)(puVar12 + 2);
  if ((function_call *)*puVar12 == pfVar24) {
    local_1a8._0_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
    local_1a8._8_8_ = puVar12[3];
    local_1b8._0_8_ = (PyObject *)local_1a8;
  }
  else {
    local_1a8._0_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
    local_1b8._0_8_ = (PyObject *)*puVar12;
  }
  local_1b8._8_8_ = puVar12[1];
  *puVar12 = pfVar24;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  uVar1 = *(ushort *)((long)&piVar26[1].field_1 + 0x11);
  iVar10 = 0x117bcb;
  if ((uVar1 & 1) != 0) {
    iVar10 = 0x117bbf;
  }
  local_108.m_ptr = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,iVar10,iVar10 + (uVar1 & 1) * 3 + 8);
  pfVar27 = (function_record *)((long)&((PyObject *)local_1b8._8_8_)->ob_refcnt + local_100);
  pfVar17 = (function_record *)0xf;
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    pfVar17 = (function_record *)local_1a8._0_8_;
  }
  if (pfVar17 < pfVar27) {
    pfVar17 = (function_record *)0xf;
    if (local_108.m_ptr != &local_f8) {
      pfVar17 = (function_record *)local_f8.ob_refcnt;
    }
    if (pfVar17 < pfVar27) goto LAB_0010d692;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,local_1b8._0_8_);
  }
  else {
LAB_0010d692:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_108.m_ptr);
  }
  local_1e8._0_8_ = local_1e8 + 0x10;
  pfVar24 = (function_call *)(puVar12 + 2);
  if ((function_call *)*puVar12 == pfVar24) {
    local_1e8._16_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
    oStack_1d0.super_handle.m_ptr = (handle)puVar12[3];
  }
  else {
    local_1e8._16_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
    local_1e8._0_8_ = (function_call *)*puVar12;
  }
  local_1e8._8_8_ = puVar12[1];
  *puVar12 = pfVar24;
  puVar12[1] = 0;
  *(undefined1 *)&((PyObject *)&pfVar24->func)->ob_refcnt = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_1e8);
  local_178 = (undefined1  [8])(auStack_170 + 8);
  piVar20 = (instance *)(plVar13 + 2);
  if ((instance *)*plVar13 == piVar20) {
    auStack_170._8_8_ = (piVar20->ob_base).ob_refcnt;
    hStack_160.m_ptr = (PyObject *)plVar13[3];
  }
  else {
    auStack_170._8_8_ = (piVar20->ob_base).ob_refcnt;
    local_178 = (undefined1  [8])*plVar13;
  }
  auStack_170._0_8_ = plVar13[1];
  *plVar13 = (long)piVar20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  if (local_108.m_ptr != &local_f8) {
    operator_delete(local_108.m_ptr,(ulong)((long)&((PyObject *)local_f8.ob_refcnt)->ob_refcnt + 1))
    ;
  }
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
  }
  if ((function_call *)local_e8._0_8_ != (function_call *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)((long)(function_record **)local_e8._16_8_ + 1));
  }
  uVar22 = 0;
  do {
    __val = uVar22 + 1;
    __len = 1;
    if (8 < uVar22) {
      uVar21 = (ulong)__val;
      uVar22 = 4;
      do {
        __len = uVar22;
        uVar9 = (uint)uVar21;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0010d834;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0010d834;
        }
        if (uVar9 < 10000) goto LAB_0010d834;
        uVar21 = uVar21 / 10000;
        uVar22 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0010d834:
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_e8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8._0_8_,__len,__val);
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x117c0d);
    local_1b8._0_8_ = local_1a8;
    pfVar24 = (function_call *)(puVar12 + 2);
    if ((function_call *)*puVar12 == pfVar24) {
      local_1a8._0_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
      local_1a8._8_8_ = puVar12[3];
    }
    else {
      local_1a8._0_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
      local_1b8._0_8_ = (PyObject *)*puVar12;
    }
    local_1b8._8_8_ = puVar12[1];
    *puVar12 = pfVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append(local_1b8);
    local_1e8._0_8_ = local_1e8 + 0x10;
    pfVar24 = (function_call *)(puVar12 + 2);
    if ((function_call *)*puVar12 == pfVar24) {
      local_1e8._16_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
      oStack_1d0.super_handle.m_ptr = (handle)puVar12[3];
    }
    else {
      local_1e8._16_8_ = ((PyObject *)&pfVar24->func)->ob_refcnt;
      local_1e8._0_8_ = (function_call *)*puVar12;
    }
    local_1e8._8_8_ = puVar12[1];
    *puVar12 = pfVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_178,local_1e8._0_8_);
    if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    if ((function_call *)local_1b8._0_8_ != (function_call *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    if ((function_call *)local_e8._0_8_ != (function_call *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)((long)(function_record **)local_e8._16_8_ + 1))
      ;
    }
    if ((*(byte *)((long)&local_c8[1].field_1 + 0x11) & 1) == 0) {
LAB_0010dabe:
      std::__cxx11::string::append((char *)local_178);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,(char *)(piVar26->field_1).nonsimple.values_and_holders,
                 (allocator<char> *)local_1b8);
      lVar14 = std::__cxx11::string::find((char)(string *)local_1e8,0x28);
      pfVar24 = (function_call *)(lVar14 + 7);
      if ((ulong)local_1e8._8_8_ <= pfVar24) {
LAB_0010daa2:
        if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        goto LAB_0010dabe;
      }
      pfVar15 = (function_call *)std::__cxx11::string::find(local_1e8,0x11779e,0);
      std::__cxx11::string::rfind(local_1e8,0x117c12,0xffffffffffffffff);
      if (pfVar15 < (ulong)local_1e8._8_8_) {
        pfVar16 = (function_call *)((long)&((PyObject *)&pfVar15->func)->ob_refcnt + 2);
      }
      else {
        pfVar16 = (function_call *)std::__cxx11::string::find((char)local_1e8,0x29);
        pfVar15 = pfVar16;
      }
      if ((pfVar15 <= pfVar24) || ((ulong)local_1e8._8_8_ <= pfVar16)) goto LAB_0010daa2;
      std::__cxx11::string::append((string *)local_178,(ulong)local_1e8,(ulong)pfVar24);
      std::__cxx11::string::push_back((char)(string *)local_178);
      std::__cxx11::string::append((string *)local_178,(ulong)local_1e8,(ulong)pfVar16);
      if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_178);
    piVar26 = (instance *)piVar26[2].field_1.nonsimple.values_and_holders;
    uVar22 = __val;
  } while (piVar26 != (instance *)0x0);
  std::__cxx11::string::append(local_178);
  local_108.m_ptr = (PyObject *)local_190;
  if (local_190 != (function_call *)0x0) {
    ((PyObject *)&local_190->func)->ob_refcnt = ((PyObject *)&local_190->func)->ob_refcnt + 1;
  }
  bVar30 = false;
  for (pfVar27 = (function_record *)(ulong)(*(ushort *)((long)&local_c8[1].field_1 + 0x11) & 1);
      pfVar17 = (function_record *)PyTuple_Size(local_108.m_ptr), pfVar27 < pfVar17;
      pfVar27 = (function_record *)((long)&((PyObject *)&pfVar27->name)->ob_refcnt + 1)) {
    bVar3 = true;
    if (bVar30) {
      std::__cxx11::string::append(local_178);
      bVar3 = bVar30;
    }
    bVar30 = bVar3;
    local_1b8._8_8_ = local_108.m_ptr;
    local_1a8._8_8_ = (PyObject *)0x0;
    local_1a8._0_8_ = pfVar27;
    poVar18 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1b8);
    local_110.m_ptr = (poVar18->super_handle).m_ptr;
    if ((function_call *)local_110.m_ptr != (function_call *)0x0) {
      ((PyObject *)&(local_110.m_ptr)->ob_refcnt)->ob_refcnt =
           ((PyObject *)&(local_110.m_ptr)->ob_refcnt)->ob_refcnt + 1;
    }
    hVar28.m_ptr = (PyObject *)PyObject_Repr(local_110.m_ptr);
    if ((function_call *)hVar28.m_ptr == (function_call *)0x0) {
      local_190 = (function_call *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set((error_already_set *)local_190);
      __cxa_throw(local_190,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_e8._0_8_ = hVar28.m_ptr;
    str::operator_cast_to_string((string *)local_1e8,(str *)local_e8);
    std::__cxx11::string::_M_append(local_178,local_1e8._0_8_);
    if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    object::~object((object *)local_e8);
    object::~object((object *)&local_110);
    object::~object((object *)(local_1a8 + 8));
  }
  if (local_188 != (function_call *)0x0) {
    local_110.m_ptr = (PyObject *)local_188;
    ((PyObject *)&local_188->func)->ob_refcnt = ((PyObject *)&local_188->func)->ob_refcnt + 1;
    lVar14 = PyDict_Size();
    if (lVar14 != 0) {
      if (bVar30) {
        std::__cxx11::string::append(local_178);
      }
      std::__cxx11::string::append(local_178);
      local_1e8._0_8_ = local_110.m_ptr;
      local_1e8._8_8_ = (function_call *)0x0;
      local_1e8._16_8_ = (function_call *)0x0;
      oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next(local_110.m_ptr,local_1e8 + 0x18,local_1e8 + 8,local_1e8 + 0x10);
      if (iVar10 == 0) {
        oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
      }
      if (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff) {
        bVar30 = true;
        do {
          local_e8._0_8_ = local_1e8._8_8_;
          local_e8._8_8_ = local_1e8._16_8_;
          if (bVar30) {
            bVar30 = false;
          }
          else {
            std::__cxx11::string::append(local_178);
          }
          str::str((str *)&local_48,"{}=");
          str::format<pybind11::handle&>((str *)&local_60,&local_48);
          str::operator_cast_to_string((string *)local_1b8,(str *)&local_60);
          std::__cxx11::string::_M_append(local_178,local_1b8._0_8_);
          if ((function_call *)local_1b8._0_8_ != (function_call *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          object::~object(&local_60);
          object::~object((object *)&local_48);
          hVar28.m_ptr = (PyObject *)PyObject_Repr(local_e8._8_8_);
          if (hVar28.m_ptr == (PyObject *)0x0) {
            local_190 = (function_call *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set((error_already_set *)local_190);
            __cxa_throw(local_190,&error_already_set::typeinfo,error_already_set::~error_already_set
                       );
          }
          local_60.super_handle.m_ptr = (handle)(handle)hVar28.m_ptr;
          str::operator_cast_to_string((string *)local_1b8,(str *)&local_60);
          std::__cxx11::string::_M_append(local_178,local_1b8._0_8_);
          if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          object::~object(&local_60);
          iVar10 = PyDict_Next(local_1e8._0_8_,local_1e8 + 0x18,local_1e8 + 8,local_1e8 + 0x10);
          if (iVar10 == 0) {
            oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
          }
        } while (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff);
      }
    }
    object::~object((object *)&local_110);
  }
  lVar14 = std::__cxx11::string::find(local_178,0x117e7d,0);
  if (lVar14 != -1) {
    std::__cxx11::string::append(local_178);
  }
  PyErr_SetString(_PyExc_TypeError,local_178);
  object::~object((object *)&local_108);
  if (local_178 == (undefined1  [8])(auStack_170 + 8)) {
    return (PyObject *)(value_and_holder *)0x0;
  }
LAB_0010e00a:
  operator_delete((void *)local_178,(ulong)((long)(PyTypeObject **)auStack_170._8_8_ + 1));
  return (PyObject *)(value_and_holder *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg = func.args[args_copied];
                        handle value;

                        if (arg.value) {
                            value = arg.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#if defined(__GNUG__) && !defined(__clang__)
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }